

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

bool __thiscall RasterizerA3<8U>::addPoly(RasterizerA3<8U> *this,Point *poly,size_t count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int y1;
  int x1;
  size_t i;
  int y0;
  int x0;
  size_t count_local;
  Point *poly_local;
  RasterizerA3<8U> *this_local;
  
  bVar1 = Rasterizer::isInitialized((Rasterizer *)this);
  if (bVar1) {
    if (1 < count) {
      i._0_4_ = (int)(poly->y * 256.0);
      i._4_4_ = (int)(poly->x * 256.0);
      for (_y1 = 1; _y1 < count; _y1 = _y1 + 1) {
        iVar2 = (int)(poly[_y1].x * 256.0);
        iVar3 = (int)(poly[_y1].y * 256.0);
        if ((i._4_4_ != iVar2) || ((int)i != iVar3)) {
          _addLine<long>(this,(long)i._4_4_,(long)(int)i,(long)iVar2,(long)iVar3);
        }
        i._0_4_ = iVar3;
        i._4_4_ = iVar2;
      }
    }
    return true;
  }
  __assert_fail("isInitialized()",
                "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                ,200,"virtual bool RasterizerA3<8>::addPoly(const Point *, size_t) [N = 8]");
}

Assistant:

bool RasterizerA3<N>::addPoly(const Point* poly, size_t count) noexcept {
  assert(isInitialized());

  if (count < 2)
    return true;

  int x0 = static_cast<int>(poly[0].x * 256);
  int y0 = static_cast<int>(poly[0].y * 256);

  for (size_t i = 1; i < count; i++) {
    int x1 = static_cast<int>(poly[i].x * 256);
    int y1 = static_cast<int>(poly[i].y * 256);

    if (x0 != x1 || y0 != y1)
      _addLine<int64_t>(x0, y0, x1, y1);

    x0 = x1;
    y0 = y1;
  }

  return true;
}